

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.cpp
# Opt level: O3

void __thiscall TPZMHMeshControl::CreateInterfaceElements(TPZMHMeshControl *this)

{
  int iVar1;
  int iVar2;
  TPZGeoEl **ppTVar3;
  TPZGeoEl *pTVar4;
  long lVar5;
  _Base_ptr p_Var6;
  TPZGeoEl *pTVar7;
  TPZInterfaceElement *this_00;
  TPZGeoEl *pTVar8;
  TPZGeoElSide neighbour_1;
  TPZGeoElSide smallGeoElSide;
  TPZGeoElSide neighbour;
  TPZGeoElSide gelside;
  _Self __tmp;
  TPZCompElSide csmall;
  TPZCompElSide celskeleton;
  TPZStack<TPZGeoElSide,_10> gelstack;
  TPZGeoElSide local_228;
  int local_210;
  int local_20c;
  TPZGeoElSide local_208;
  undefined **local_1f0;
  TPZGeoEl *local_1e8;
  int local_1e0;
  TPZGeoElSide local_1d8;
  undefined **local_1c0;
  TPZGeoEl *local_1b8;
  int local_1b0;
  TPZGeoEl *local_1a8;
  int local_1a0;
  _func_int **local_198;
  _func_int **local_190;
  _Base_ptr local_188;
  _Base_ptr local_180;
  TPZGeoEl *local_178;
  _Base_ptr local_170;
  _Base_ptr local_168;
  TPZCompElSide local_160;
  TPZCompElSide local_150;
  undefined1 local_140 [272];
  
  TPZCompMesh::LoadReferences(((this->fCMesh).fRef)->fPointer);
  local_180 = (this->fInterfaces)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_188 = &(this->fInterfaces)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (local_180 != local_188) {
    local_190 = (_func_int **)&PTR__TPZManVector_0181a6d0;
    local_198 = (_func_int **)&PTR__TPZVec_018141b0;
    do {
      local_168 = local_180[1]._M_parent;
      local_170 = local_180[1]._M_left;
      local_210 = this->fLagrangeMatIdLeft;
      local_20c = this->fLagrangeMatIdRight;
      if (local_170 == *(_Base_ptr *)(local_180 + 1) || (long)local_168 < (long)local_170) {
        local_210 = this->fLagrangeMatIdRight;
        local_20c = this->fLagrangeMatIdLeft;
      }
      ppTVar3 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                          (&(((this->fGMesh).fRef)->fPointer->fElementVec).
                            super_TPZChunkVector<TPZGeoEl_*,_10>,
                           (int64_t)*(_Base_ptr *)(local_180 + 1));
      pTVar7 = *ppTVar3;
      local_1d8.fSide = (**(code **)(*(long *)pTVar7 + 0xf0))(pTVar7);
      local_1d8.fSide = local_1d8.fSide + -1;
      local_1d8.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_018f8760;
      local_1d8.fGeoEl = pTVar7;
      local_178 = pTVar7;
      TPZGeoElSide::Reference(&local_1d8);
      if (local_150.fEl == (TPZCompEl *)0x0) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
                   ,0x311);
      }
      if (local_1d8.fGeoEl == (TPZGeoEl *)0x0) {
        local_1f0 = &PTR__TPZGeoElSide_018f8760;
        local_1e8 = (TPZGeoEl *)0x0;
        local_1e0 = -1;
        pTVar7 = (TPZGeoEl *)0x0;
      }
      else {
        (**(code **)(*(long *)local_1d8.fGeoEl + 0x188))
                  (&local_1f0,local_1d8.fGeoEl,local_1d8.fSide);
        pTVar7 = local_1d8.fGeoEl;
      }
      pTVar4 = pTVar7;
      pTVar8 = pTVar7;
      iVar1 = local_1e0;
      if (local_1e8 != pTVar7 || local_1e0 != local_1d8.fSide) {
        do {
          pTVar7 = pTVar4;
          pTVar8 = local_1e8;
          iVar1 = local_1d8.fSide;
          if ((local_1e8->fMatId == this->fSkeletonWrapMatId) ||
             (local_1e8->fMatId == this->fBoundaryWrapMatId)) break;
          (**(code **)(*(long *)local_1e8 + 0x188))(local_140);
          local_1e0 = local_140._16_4_;
          local_1e8 = (TPZGeoEl *)local_140._8_8_;
          pTVar7 = (TPZGeoEl *)local_140._8_8_;
          pTVar4 = local_1d8.fGeoEl;
          pTVar8 = (TPZGeoEl *)local_140._8_8_;
          iVar1 = local_140._16_4_;
        } while (local_140._16_4_ != local_1d8.fSide ||
                 (TPZGeoEl *)local_140._8_8_ != local_1d8.fGeoEl);
      }
      if ((pTVar8 == pTVar7) && (local_1e0 == iVar1)) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
                   ,0x31d);
      }
      lVar5 = 0x30;
      do {
        *(undefined ***)(local_140 + lVar5 + -0x10) = &PTR__TPZGeoElSide_018f8760;
        *(undefined8 *)(local_140 + lVar5 + -8) = 0;
        *(undefined4 *)(local_140 + lVar5) = 0xffffffff;
        lVar5 = lVar5 + 0x18;
      } while (lVar5 != 0x120);
      local_140._8_8_ = local_140 + 0x20;
      local_140._16_8_ = 0;
      local_140._24_8_ = 0;
      local_140._0_8_ = local_190;
      local_1a8 = local_1e8;
      local_1a0 = local_1e0;
      TPZManVector<TPZGeoElSide,_10>::Resize((TPZManVector<TPZGeoElSide,_10> *)local_140,1);
      *(int *)(local_140._8_8_ + local_140._16_8_ * 0x18 + -8) = local_1a0;
      *(TPZGeoEl **)(local_140._8_8_ + local_140._16_8_ * 0x18 + -0x10) = local_1a8;
      while (local_140._16_8_ != 0) {
        TPZStack<TPZGeoElSide,_10>::Pop(&local_208,(TPZStack<TPZGeoElSide,_10> *)local_140);
        iVar1 = TPZGeoElSide::Dimension(&local_208);
        iVar2 = (**(code **)(*(long *)local_178 + 0x210))();
        if (iVar1 == iVar2) {
          if (local_208.fGeoEl == (TPZGeoEl *)0x0) {
            local_228.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_018f8760;
            local_228.fGeoEl = (TPZGeoEl *)0x0;
            local_228.fSide = -1;
            pTVar7 = (TPZGeoEl *)0x0;
          }
          else {
            (**(code **)(*(long *)local_208.fGeoEl + 0x188))
                      (&local_228,local_208.fGeoEl,local_208.fSide);
            pTVar7 = local_208.fGeoEl;
          }
          if ((local_228.fGeoEl != pTVar7) || (local_228.fSide != local_208.fSide)) {
            do {
              iVar1 = (**(code **)(*(long *)local_228.fGeoEl + 0x210))();
              if (iVar1 == ((this->fGMesh).fRef)->fPointer->fDim) {
                TPZGeoElSide::Reference(&local_228);
                if (local_160.fEl != (TPZCompEl *)0x0) {
                  p_Var6 = (_Base_ptr)WhichSubdomain(this,local_160.fEl);
                  iVar1 = local_20c;
                  if (((p_Var6 != local_168) &&
                      (p_Var6 = (_Base_ptr)WhichSubdomain(this,local_160.fEl), iVar1 = local_210,
                      p_Var6 != local_170)) || (iVar1 == -1)) {
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
                               ,0x33d);
                  }
                  pTVar7 = (TPZGeoEl *)
                           (**(code **)(*(long *)local_208.fGeoEl + 0x170))
                                     (local_208.fGeoEl,local_208.fSide,iVar1);
                  this_00 = (TPZInterfaceElement *)operator_new(0x80);
                  TPZInterfaceElement::TPZInterfaceElement
                            (this_00,((this->fCMesh).fRef)->fPointer,pTVar7,&local_160,&local_150);
                }
                if (local_228.fGeoEl == (TPZGeoEl *)0x0) {
LAB_01397fe6:
                  local_1c0 = &PTR__TPZGeoElSide_018f8760;
                  local_1b8 = (TPZGeoEl *)0x0;
                  local_1b0 = -1;
                }
                else {
                  (**(code **)(*(long *)local_228.fGeoEl + 0x188))
                            (&local_1c0,local_228.fGeoEl,local_228.fSide);
                }
              }
              else {
                if (local_228.fGeoEl == (TPZGeoEl *)0x0) goto LAB_01397fe6;
                (**(code **)(*(long *)local_228.fGeoEl + 0x188))
                          (&local_1c0,local_228.fGeoEl,local_228.fSide);
              }
              local_228.fSide = local_1b0;
              local_228.fGeoEl = local_1b8;
            } while ((local_1b8 != local_208.fGeoEl) || (local_1b0 != local_208.fSide));
          }
          TPZGeoElSide::GetSubElements2(&local_208,(TPZStack<TPZGeoElSide,_10> *)local_140);
        }
      }
      if ((TPZGeoEl *)local_140._8_8_ != (TPZGeoEl *)(local_140 + 0x20)) {
        local_140._24_8_ = 0;
        local_140._0_8_ = local_198;
        if ((TPZGeoEl *)local_140._8_8_ != (TPZGeoEl *)0x0) {
          operator_delete__(&((TPZGeoEl *)(local_140._8_8_ + -0x40))->fNumInterfaces,
                            *(long *)&((TPZGeoEl *)(local_140._8_8_ + -0x40))->fNumInterfaces * 0x18
                            + 8);
        }
      }
      local_180 = (_Base_ptr)std::_Rb_tree_increment(local_180);
    } while (local_180 != local_188);
  }
  return;
}

Assistant:

void TPZMHMeshControl::CreateInterfaceElements()
{
    fCMesh->LoadReferences();
    int dim = fGMesh->Dimension();
    std::map<int64_t, std::pair<int64_t,int64_t> >::iterator it;
    /// loop over the skeleton elements
    for (it=fInterfaces.begin(); it != fInterfaces.end(); it++) {
        // index of the skeleton element
        int64_t elindex = it->first;
        // left and right indexes in the coarse mesh
        int64_t leftelindex = it->second.first;
        int64_t rightelindex = it->second.second;
        // skip boundary elements
        int matid = 0, matidleft = 0, matidright = 0;

        // second condition indicates a boundary element
        if (leftelindex < rightelindex || rightelindex == elindex)
        {
            matidleft = fLagrangeMatIdLeft;
            matidright = fLagrangeMatIdRight;
        }
        else
        {
            matidleft = fLagrangeMatIdRight;
            matidright = fLagrangeMatIdLeft;
        }
        int numlado = 2;
        if (rightelindex == elindex) {
            numlado = 1;
        }

        TPZGeoEl *gel = fGMesh->ElementVec()[elindex];
        TPZGeoElSide gelside(gel,gel->NSides()-1);
        TPZCompElSide celskeleton = gelside.Reference();
        // the skeleton element must exist
        if(!celskeleton.Element()) DebugStop();
        TPZGeoElSide neighbour = gelside.Neighbour();
        while(neighbour != gelside)
        {
            int neighmatid = neighbour.Element()->MaterialId();
            if(neighmatid == fSkeletonWrapMatId || neighmatid == fBoundaryWrapMatId)
            {
                break;
            }
            neighbour = neighbour.Neighbour();
        }
        if (neighbour == gelside) {
            DebugStop();
        }
        TPZStack<TPZGeoElSide> gelstack;
        gelstack.Push(neighbour);
        while (gelstack.size())
        {
            TPZGeoElSide smallGeoElSide = gelstack.Pop();
            // the smaller elements returned by GetSubElements include element/sides of lower dimension
            if (smallGeoElSide.Dimension() != gel->Dimension()) {
                continue;
            }
            // look for the neighbours of smallGeoElSide for elements which are of dimension of the fGMesh
            // and which beint64_t to the subdomains
            TPZGeoElSide neighbour = smallGeoElSide.Neighbour();
            while (neighbour != smallGeoElSide)
            {
                if (neighbour.Element()->Dimension() != fGMesh->Dimension()) {
                    neighbour = neighbour.Neighbour();
                    continue;
                }
                TPZCompElSide csmall = neighbour.Reference();
                if (csmall)
                {
                    int matid = -1;
                    if(WhichSubdomain(csmall.Element()) == leftelindex) {
                        matid = matidleft;
                    }
                    else if(WhichSubdomain(csmall.Element()) == rightelindex)
                    {
                        matid = matidright;
                    }
                    if (matid == -1) {
                        DebugStop();
                    }
                    // create an interface between the finer element and the MHM flux
                    TPZGeoEl *gelnew = smallGeoElSide.Element()->CreateBCGeoEl(smallGeoElSide.Side(), matid);
                    new TPZInterfaceElement(fCMesh, gelnew, csmall, celskeleton);
#ifdef PZ_LOG
                    if (logger.isDebugEnabled()) {
                        std::stringstream sout;
                        sout << "New interface left " << smallGeoElSide.Element()->Index() << " right " << gel->Index() << " matid " << matid;
                        sout << " interface index " << gelnew->Reference()->Index() << " beint64_ts to subdomain " << WhichSubdomain(gelnew->Reference());
                        LOGPZ_DEBUG(logger, sout.str())
                    }
#endif
                }
                neighbour = neighbour.Neighbour();
            }

            smallGeoElSide.GetSubElements2(gelstack);
        }
    }
}